

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

void BackwardRefsSwap(VP8LBackwardRefs *refs1,VP8LBackwardRefs *refs2)

{
  void *in_RSI;
  void *in_RDI;
  VP8LBackwardRefs tmp;
  int point_to_refs2;
  int point_to_refs1;
  bool local_42;
  bool local_41;
  undefined1 local_40 [40];
  uint local_18;
  uint local_14;
  void *local_10;
  void *local_8;
  
  local_41 = false;
  if (*(long *)((long)in_RDI + 0x10) != 0) {
    local_41 = *(long *)((long)in_RDI + 0x10) == (long)in_RDI + 8;
  }
  local_14 = (uint)local_41;
  local_42 = false;
  if (*(long *)((long)in_RSI + 0x10) != 0) {
    local_42 = *(long *)((long)in_RSI + 0x10) == (long)in_RSI + 8;
  }
  local_18 = (uint)local_42;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memcpy(local_40,in_RDI,0x28);
  memcpy(local_8,local_10,0x28);
  memcpy(local_10,local_40,0x28);
  if (local_18 != 0) {
    *(long *)((long)local_8 + 0x10) = (long)local_8 + 8;
  }
  if (local_14 != 0) {
    *(long *)((long)local_10 + 0x10) = (long)local_10 + 8;
  }
  return;
}

Assistant:

static void BackwardRefsSwap(VP8LBackwardRefs* const refs1,
                             VP8LBackwardRefs* const refs2) {
  const int point_to_refs1 =
      (refs1->tail != NULL && refs1->tail == &refs1->refs);
  const int point_to_refs2 =
      (refs2->tail != NULL && refs2->tail == &refs2->refs);
  const VP8LBackwardRefs tmp = *refs1;
  *refs1 = *refs2;
  *refs2 = tmp;
  if (point_to_refs2) refs1->tail = &refs1->refs;
  if (point_to_refs1) refs2->tail = &refs2->refs;
}